

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataDictionary.cpp
# Opt level: O1

void __thiscall
FIX::DataDictionary::addXMLGroup
          (DataDictionary *this,DOMDocument *pDoc,DOMNode *pNode,string *msgtype,DataDictionary *DD,
          bool groupRequired)

{
  _func_int **pp_Var1;
  DOMNode *pDVar2;
  long *plVar3;
  DOMNode *pDVar4;
  char cVar5;
  int iVar6;
  int iVar7;
  int field;
  _Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *p_Var8;
  ConfigError *this_00;
  pointer *__ptr;
  DOMDocument *pDVar9;
  undefined7 in_register_00000089;
  bool groupRequired_00;
  DOMNodePtr node;
  DOMAttributesPtr attrs_1;
  string required;
  string name;
  DOMAttributesPtr attrs;
  DataDictionary groupDD;
  DOMNode *local_4b8;
  long *local_4b0;
  long *local_4a8 [2];
  long local_498 [2];
  DOMNode *local_488;
  undefined8 local_480;
  DOMNode local_478 [2];
  string *local_468;
  DataDictionary *local_460;
  undefined4 local_458;
  int local_454;
  string local_450;
  DOMDocument *local_430;
  long *local_428;
  DataDictionary *local_420;
  undefined1 local_418 [160];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  local_378 [17];
  
  local_458 = (undefined4)CONCAT71(in_register_00000089,groupRequired);
  local_468 = msgtype;
  local_460 = this;
  local_430 = pDoc;
  (*pNode->_vptr_DOMNode[4])(&local_428,pNode);
  plVar3 = local_428;
  local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
  local_450._M_string_length = 0;
  local_450.field_2._M_local_buf[0] = '\0';
  pp_Var1 = (_func_int **)(local_418 + 0x10);
  local_418._0_8_ = pp_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"name","");
  pDVar9 = (DOMDocument *)local_418;
  cVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,pDVar9,&local_450);
  if ((_func_int **)local_418._0_8_ != pp_Var1) {
    pDVar9 = (DOMDocument *)(local_418._16_8_ + 1);
    operator_delete((void *)local_418._0_8_,(ulong)pDVar9);
  }
  if (cVar5 == '\0') {
    this_00 = (ConfigError *)__cxa_allocate_exception(0x50);
    local_418._0_8_ = pp_Var1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"No name given to group","")
    ;
    ConfigError::ConfigError(this_00,(string *)local_418);
    __cxa_throw(this_00,&ConfigError::typeinfo,FIX::Exception::~Exception);
  }
  iVar6 = lookupXMLFieldNumber(local_460,pDVar9,&local_450);
  DataDictionary((DataDictionary *)local_418);
  (*pNode->_vptr_DOMNode[2])(&local_4b8,pNode);
  local_454 = iVar6;
  local_420 = DD;
  if (local_4b8 == (DOMNode *)0x0) {
    iVar6 = 0;
  }
  else {
    field = 0;
    iVar6 = 0;
    do {
      (*local_4b8->_vptr_DOMNode[5])(&local_488);
      pDVar9 = (DOMDocument *)0x1c40aa;
      iVar7 = std::__cxx11::string::compare((char *)&local_488);
      if (local_488 != local_478) {
        pDVar9 = (DOMDocument *)
                 (CONCAT71(local_478[0]._vptr_DOMNode._1_7_,local_478[0]._vptr_DOMNode._0_1_) + 1);
        operator_delete(local_488,(ulong)pDVar9);
      }
      if (iVar7 == 0) {
        field = lookupXMLFieldNumber(local_460,pDVar9,local_4b8);
        addField((DataDictionary *)local_418,field);
        (*local_4b8->_vptr_DOMNode[4])(&local_4b0);
        plVar3 = local_4b0;
        local_480 = 0;
        local_478[0]._vptr_DOMNode._0_1_ = 0;
        local_4a8[0] = local_498;
        local_488 = local_478;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"required","");
        cVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,(string *)local_4a8,&local_488);
        if ((cVar5 == '\0') ||
           ((iVar7 = std::__cxx11::string::compare((char *)&local_488), iVar7 != 0 &&
            (iVar7 = std::__cxx11::string::compare((char *)&local_488), iVar7 != 0)))) {
          if (local_4a8[0] != local_498) {
            operator_delete(local_4a8[0],local_498[0] + 1);
          }
        }
        else {
          if (local_4a8[0] != local_498) {
            operator_delete(local_4a8[0],local_498[0] + 1);
          }
          if ((char)local_458 != '\0') {
            local_4a8[0] = (long *)CONCAT44(local_4a8[0]._4_4_,field);
            p_Var8 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                     std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                     ::operator[](local_378,local_468);
            std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>(p_Var8,(int *)local_4a8);
          }
        }
LAB_00159641:
        if (local_488 != local_478) {
          operator_delete(local_488,
                          CONCAT71(local_478[0]._vptr_DOMNode._1_7_,local_478[0]._vptr_DOMNode._0_1_
                                  ) + 1);
        }
        if (local_4b0 != (long *)0x0) {
          (**(code **)(*local_4b0 + 8))();
        }
      }
      else {
        (*local_4b8->_vptr_DOMNode[5])(&local_488);
        iVar7 = std::__cxx11::string::compare((char *)&local_488);
        if (local_488 != local_478) {
          operator_delete(local_488,
                          CONCAT71(local_478[0]._vptr_DOMNode._1_7_,local_478[0]._vptr_DOMNode._0_1_
                                  ) + 1);
        }
        if (iVar7 == 0) {
          field = addXMLComponentFields
                            (local_460,local_430,local_4b8,local_468,(DataDictionary *)local_418,
                             false);
        }
        else {
          (*local_4b8->_vptr_DOMNode[5])(&local_488);
          pDVar9 = (DOMDocument *)0x1bf8a2;
          iVar7 = std::__cxx11::string::compare((char *)&local_488);
          if (local_488 != local_478) {
            pDVar9 = (DOMDocument *)
                     (CONCAT71(local_478[0]._vptr_DOMNode._1_7_,local_478[0]._vptr_DOMNode._0_1_) +
                     1);
            operator_delete(local_488,(ulong)pDVar9);
          }
          if (iVar7 == 0) {
            field = lookupXMLFieldNumber(local_460,pDVar9,local_4b8);
            addField((DataDictionary *)local_418,field);
            (*local_4b8->_vptr_DOMNode[4])(&local_4b0);
            plVar3 = local_4b0;
            local_480 = 0;
            local_478[0]._vptr_DOMNode._0_1_ = 0;
            local_4a8[0] = local_498;
            local_488 = local_478;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"required","");
            cVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,(string *)local_4a8,&local_488);
            if ((cVar5 == '\0') ||
               ((iVar7 = std::__cxx11::string::compare((char *)&local_488), iVar7 != 0 &&
                (iVar7 = std::__cxx11::string::compare((char *)&local_488), iVar7 != 0)))) {
              if (local_4a8[0] != local_498) {
                operator_delete(local_4a8[0],local_498[0] + 1);
              }
            }
            else {
              if (local_4a8[0] != local_498) {
                operator_delete(local_4a8[0],local_498[0] + 1);
              }
              if ((char)local_458 != '\0') {
                local_4a8[0] = (long *)CONCAT44(local_4a8[0]._4_4_,field);
                p_Var8 = (_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *
                         )std::
                          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                          ::operator[](local_378,local_468);
                std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
                _M_insert_unique<int_const&>(p_Var8,(int *)local_4a8);
              }
            }
            plVar3 = local_4b0;
            local_4a8[0] = local_498;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_4a8,"required","");
            cVar5 = (**(code **)(*plVar3 + 0x10))(plVar3,(string *)local_4a8,&local_488);
            if (local_4a8[0] != local_498) {
              operator_delete(local_4a8[0],local_498[0] + 1);
            }
            if (cVar5 == '\0') {
              groupRequired_00 = false;
            }
            else {
              iVar7 = std::__cxx11::string::compare((char *)&local_488);
              if (iVar7 == 0) {
                groupRequired_00 = true;
              }
              else {
                iVar7 = std::__cxx11::string::compare((char *)&local_488);
                groupRequired_00 = iVar7 == 0;
              }
            }
            addXMLGroup(local_460,local_430,local_4b8,local_468,(DataDictionary *)local_418,
                        groupRequired_00);
            goto LAB_00159641;
          }
        }
      }
      if (iVar6 == 0) {
        iVar6 = field;
      }
      (*local_4b8->_vptr_DOMNode[3])(&local_488);
      pDVar4 = local_488;
      pDVar2 = local_4b8;
      local_488 = (DOMNode *)0x0;
      local_4b8 = pDVar4;
      if (pDVar2 != (DOMNode *)0x0) {
        (*pDVar2->_vptr_DOMNode[1])();
      }
      if (local_488 != (DOMNode *)0x0) {
        (*local_488->_vptr_DOMNode[1])();
      }
    } while (local_4b8 != (DOMNode *)0x0);
  }
  if (iVar6 != 0) {
    addGroup(local_420,local_468,local_454,iVar6,(DataDictionary *)local_418);
  }
  if (local_4b8 != (DOMNode *)0x0) {
    (*local_4b8->_vptr_DOMNode[1])();
  }
  ~DataDictionary((DataDictionary *)local_418);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_450._M_dataplus._M_p != &local_450.field_2) {
    operator_delete(local_450._M_dataplus._M_p,
                    CONCAT71(local_450.field_2._M_allocated_capacity._1_7_,
                             local_450.field_2._M_local_buf[0]) + 1);
  }
  if (local_428 != (long *)0x0) {
    (**(code **)(*local_428 + 8))();
  }
  return;
}

Assistant:

void DataDictionary::addXMLGroup( DOMDocument* pDoc, DOMNode* pNode,
                                  const std::string& msgtype,
                                  DataDictionary& DD, bool groupRequired  )
{
  DOMAttributesPtr attrs = pNode->getAttributes();
  std::string name;
  if(!attrs->get("name", name))
    throw ConfigError("No name given to group");
  int group = lookupXMLFieldNumber( pDoc, name );
  int delim = 0;
  int field = 0;
  DataDictionary groupDD;
  DOMNodePtr node = pNode->getFirstChildNode();
  while(node.get())
  {
    if( node->getName() == "field" )
    {
      field = lookupXMLFieldNumber( pDoc, node.get() );
      groupDD.addField( field );

      DOMAttributesPtr attrs = node->getAttributes();
      std::string required;
      if( attrs->get("required", required)
         && ( required == "Y" || required =="y" )
         && groupRequired )
      {
        groupDD.addRequiredField(msgtype, field);
      }
    }
    else if( node->getName() == "component" )
    {
      field = addXMLComponentFields( pDoc, node.get(), msgtype, groupDD, false );
    }
    else if( node->getName() == "group" )
    {
      field = lookupXMLFieldNumber( pDoc, node.get() );
      groupDD.addField( field );
      DOMAttributesPtr attrs = node->getAttributes();
      std::string required;
      if( attrs->get("required", required )
         && ( required == "Y" || required =="y" )
         && groupRequired)
      {
        groupDD.addRequiredField(msgtype, field);
      }
      bool isRequired = false;
      if( attrs->get("required", required) )
      isRequired = (required == "Y" || required == "y");
      addXMLGroup( pDoc, node.get(), msgtype, groupDD, isRequired );
    }
    if( delim == 0 ) delim = field;
    RESET_AUTO_PTR(node, node->getNextSiblingNode());
  }

  if( delim ) DD.addGroup( msgtype, group, delim, groupDD );
}